

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Classifier __thiscall CLI::App::_recognize(App *this,string *current,bool ignore_used_subcommands)

{
  bool bVar1;
  int iVar2;
  Option *pOVar3;
  Classifier CVar4;
  string dummy1;
  string dummy2;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  iVar2 = ::std::__cxx11::string::compare((char *)current);
  if (iVar2 == 0) {
    CVar4 = POSITIONAL_MARK;
    goto LAB_0011daf8;
  }
  bVar1 = _valid_subcommand(this,current,ignore_used_subcommands);
  CVar4 = SUBCOMMAND;
  if (bVar1) goto LAB_0011daf8;
  bVar1 = detail::split_long(current,&local_90,&local_70);
  CVar4 = LONG;
  if (bVar1) goto LAB_0011daf8;
  bVar1 = detail::split_short(current,&local_90,&local_70);
  if (bVar1) {
    if ((byte)(*local_90._M_dataplus._M_p - 0x30U) < 10) {
      local_50.field_2._M_allocated_capacity._0_2_ =
           (ushort)(byte)*local_90._M_dataplus._M_p << 8 | 0x2d;
      local_50._M_string_length = 2;
      local_50.field_2._M_local_buf[2] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pOVar3 = get_option_no_throw(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (pOVar3 == (Option *)0x0) goto LAB_0011db5e;
    }
    CVar4 = SHORT;
  }
  else {
    if (this->allow_windows_style_options_ == true) {
      bVar1 = detail::split_windows_style(current,&local_90,&local_70);
      CVar4 = WINDOWS;
      if (bVar1) goto LAB_0011daf8;
    }
    iVar2 = ::std::__cxx11::string::compare((char *)current);
    if (((iVar2 == 0) && ((this->name_)._M_string_length != 0)) &&
       (CVar4 = SUBCOMMAND_TERMINATOR, this->parent_ != (App *)0x0)) goto LAB_0011daf8;
LAB_0011db5e:
    CVar4 = NONE;
  }
LAB_0011daf8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return CVar4;
}

Assistant:

detail::Classifier _recognize(const std::string &current, bool ignore_used_subcommands = true) const {
        std::string dummy1, dummy2;

        if(current == "--")
            return detail::Classifier::POSITIONAL_MARK;
        if(_valid_subcommand(current, ignore_used_subcommands))
            return detail::Classifier::SUBCOMMAND;
        if(detail::split_long(current, dummy1, dummy2))
            return detail::Classifier::LONG;
        if(detail::split_short(current, dummy1, dummy2)) {
            if(dummy1[0] >= '0' && dummy1[0] <= '9') {
                if(get_option_no_throw(std::string{'-', dummy1[0]}) == nullptr) {
                    return detail::Classifier::NONE;
                }
            }
            return detail::Classifier::SHORT;
        }
        if((allow_windows_style_options_) && (detail::split_windows_style(current, dummy1, dummy2)))
            return detail::Classifier::WINDOWS;
        if((current == "++") && !name_.empty() && parent_ != nullptr)
            return detail::Classifier::SUBCOMMAND_TERMINATOR;
        return detail::Classifier::NONE;
    }